

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool __thiscall
cmStringCommand::RegexReplace
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *delimiter;
  pointer pcVar1;
  bool bVar2;
  long *plVar3;
  size_type *psVar4;
  pointer pbVar5;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  string output;
  string input;
  cmStringReplaceHelper replaceHelper;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  undefined1 local_1e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  string local_1a8;
  cmStringReplaceHelper local_188;
  
  pbVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar1 = pbVar5[3]._M_dataplus._M_p;
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,pcVar1,pcVar1 + pbVar5[3]._M_string_length);
  cmStringReplaceHelper::cmStringReplaceHelper
            (&local_188,pbVar5 + 2,&local_1a8,(this->super_cmCommand).Makefile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if (local_188.ValidReplaceExpression == false) {
    std::operator+(&local_228,"sub-command REGEX, mode REPLACE: ",&local_188.ErrorString);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_228);
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_208.field_2._M_allocated_capacity = *psVar4;
      local_208.field_2._8_8_ = plVar3[3];
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    }
    else {
      local_208.field_2._M_allocated_capacity = *psVar4;
      local_208._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_208._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    cmCommand::SetError(&this->super_cmCommand,&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      uVar6 = CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                       local_228.field_2._M_local_buf[0]);
      _Var7._M_p = local_228._M_dataplus._M_p;
LAB_0025d111:
      operator_delete(_Var7._M_p,uVar6 + 1);
    }
  }
  else {
    cmMakefile::ClearMatches((this->super_cmCommand).Makefile);
    if (local_188.RegularExpression.program != (char *)0x0) {
      local_1e8._0_8_ =
           (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start + 5;
      local_1e8._8_8_ =
           (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      delimiter = &local_228.field_2;
      local_228._M_string_length = 0;
      local_228.field_2._M_local_buf[0] = '\0';
      local_228._M_dataplus._M_p = (pointer)delimiter;
      cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                (&local_208,
                 (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)local_1e8,delimiter->_M_local_buf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != delimiter) {
        operator_delete(local_228._M_dataplus._M_p,
                        CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                 local_228.field_2._M_local_buf[0]) + 1);
      }
      local_228._M_string_length = 0;
      local_228.field_2._M_local_buf[0] = '\0';
      local_228._M_dataplus._M_p = (pointer)delimiter;
      bVar2 = cmStringReplaceHelper::Replace(&local_188,&local_208,&local_228);
      if (bVar2) {
        cmMakefile::AddDefinition
                  ((this->super_cmCommand).Makefile,pbVar5 + 4,local_228._M_dataplus._M_p);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8,"sub-command REGEX, mode REPLACE: ",&local_188.ErrorString);
        plVar3 = (long *)std::__cxx11::string::append(local_1c8._M_local_buf);
        pbVar5 = (pointer)(plVar3 + 2);
        if ((pointer)*plVar3 == pbVar5) {
          local_1e8._16_8_ = (pbVar5->_M_dataplus)._M_p;
          local_1e8._24_8_ = plVar3[3];
          local_1e8._0_8_ = (pointer)(local_1e8 + 0x10);
        }
        else {
          local_1e8._16_8_ = (pbVar5->_M_dataplus)._M_p;
          local_1e8._0_8_ = (pointer)*plVar3;
        }
        local_1e8._8_8_ = plVar3[1];
        *plVar3 = (long)pbVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        cmCommand::SetError(&this->super_cmCommand,(string *)local_1e8);
        if ((pointer)local_1e8._0_8_ != (pointer)(local_1e8 + 0x10)) {
          operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_allocated_capacity != &local_1b8) {
          operator_delete((void *)local_1c8._M_allocated_capacity,
                          local_1b8._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != delimiter) {
        operator_delete(local_228._M_dataplus._M_p,
                        CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                 local_228.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0025d1ae;
    }
    std::operator+(&local_228,"sub-command REGEX, mode REPLACE failed to compile regex \"",
                   pbVar5 + 2);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_228);
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_208.field_2._M_allocated_capacity = *psVar4;
      local_208.field_2._8_8_ = plVar3[3];
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    }
    else {
      local_208.field_2._M_allocated_capacity = *psVar4;
      local_208._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_208._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,
                      CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                               local_228.field_2._M_local_buf[0]) + 1);
    }
    cmCommand::SetError(&this->super_cmCommand,&local_208);
    uVar6 = local_208.field_2._M_allocated_capacity;
    _Var7._M_p = local_208._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) goto LAB_0025d111;
  }
  bVar2 = false;
LAB_0025d1ae:
  std::
  vector<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
  ::~vector(&local_188.Replacements);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.ReplaceExpression._M_dataplus._M_p != &local_188.ReplaceExpression.field_2) {
    operator_delete(local_188.ReplaceExpression._M_dataplus._M_p,
                    local_188.ReplaceExpression.field_2._M_allocated_capacity + 1);
  }
  if (local_188.RegularExpression.program != (char *)0x0) {
    operator_delete__(local_188.RegularExpression.program);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.RegExString._M_dataplus._M_p != &local_188.RegExString.field_2) {
    operator_delete(local_188.RegExString._M_dataplus._M_p,
                    local_188.RegExString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.ErrorString._M_dataplus._M_p != &local_188.ErrorString.field_2) {
    operator_delete(local_188.ErrorString._M_dataplus._M_p,
                    local_188.ErrorString.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmStringCommand::RegexReplace(std::vector<std::string> const& args)
{
  //"STRING(REGEX REPLACE <regular_expression> <replace_expression>
  // <output variable> <input> [<input>...])\n"
  std::string const& regex = args[2];
  std::string const& replace = args[3];
  std::string const& outvar = args[4];
  cmStringReplaceHelper replaceHelper(regex, replace, this->Makefile);

  if (!replaceHelper.IsReplaceExpressionValid()) {
    this->SetError(
      "sub-command REGEX, mode REPLACE: " + replaceHelper.GetError() + ".");
    return false;
  }

  this->Makefile->ClearMatches();

  if (!replaceHelper.IsRegularExpressionValid()) {
    std::string e =
      "sub-command REGEX, mode REPLACE failed to compile regex \"" + regex +
      "\".";
    this->SetError(e);
    return false;
  }

  // Concatenate all the last arguments together.
  const std::string input =
    cmJoin(cmMakeRange(args).advance(5), std::string());
  std::string output;

  if (!replaceHelper.Replace(input, output)) {
    this->SetError(
      "sub-command REGEX, mode REPLACE: " + replaceHelper.GetError() + ".");
    return false;
  }

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}